

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> * __thiscall
plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::next
          (margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           *__return_storage_ptr__,
          margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *this)

{
  long lVar1;
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *pMVar2;
  ptrdiff_t overflow;
  block_iterator line;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  __x;
  block_iterator line_00;
  block_iterator end;
  block_iterator end_00;
  bool bVar3;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  const_iterator cStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  const_iterator cStack_a8;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  local_a0;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  const_iterator cStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  const_iterator cStack_18;
  margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *local_10;
  margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *this_local;
  
  local_10 = this;
  if ((this->overflow_ == 0) &&
     (bVar3 = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
              ::operator==(&this->line_,&this->end_), !bVar3)) {
    pMVar2 = this->margin_;
    overflow = this->overflow_;
    memcpy(&local_d0,&this->line_,0x30);
    __x.line_.overflow_ = uStack_c8;
    __x.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)local_d0;
    __x.line_.line_.line_.canvas_ = (BrailleCanvas *)local_c0;
    __x.line_.line_.line_.it_._M_current = (block_t *)uStack_b8;
    __x.line_.end_.line_.canvas_ = (BrailleCanvas *)local_b0;
    __x.line_.end_.line_.it_._M_current = cStack_a8._M_current;
    std::
    next<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
              (&local_a0,__x,1);
    memcpy(&local_100,&this->end_,0x30);
    line_00.line_.overflow_ = local_a0.line_.overflow_;
    line_00.line_.frame_ = local_a0.line_.frame_;
    line_00.line_.line_.line_.canvas_ = local_a0.line_.line_.line_.canvas_;
    line_00.line_.line_.line_.it_._M_current = local_a0.line_.line_.line_.it_._M_current;
    line_00.line_.end_.line_.canvas_ = local_a0.line_.end_.line_.canvas_;
    line_00.line_.end_.line_.it_._M_current = local_a0.line_.end_.line_.it_._M_current;
    end_00.line_.overflow_ = uStack_f8;
    end_00.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)local_100;
    end_00.line_.line_.line_.canvas_ = (BrailleCanvas *)local_f0;
    end_00.line_.line_.line_.it_._M_current = (block_t *)uStack_e8;
    end_00.line_.end_.line_.canvas_ = (BrailleCanvas *)local_e0;
    end_00.line_.end_.line_.it_._M_current = cStack_d8._M_current;
    margin_line(__return_storage_ptr__,pMVar2,overflow,line_00,end_00);
    return __return_storage_ptr__;
  }
  pMVar2 = this->margin_;
  lVar1 = this->overflow_;
  memcpy(&local_40,&this->line_,0x30);
  memcpy(&local_70,&this->end_,0x30);
  line.line_.overflow_ = uStack_38;
  line.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)local_40;
  line.line_.line_.line_.canvas_ = (BrailleCanvas *)local_30;
  line.line_.line_.line_.it_._M_current = (block_t *)uStack_28;
  line.line_.end_.line_.canvas_ = (BrailleCanvas *)local_20;
  line.line_.end_.line_.it_._M_current = cStack_18._M_current;
  end.line_.overflow_ = uStack_68;
  end.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)local_70;
  end.line_.line_.line_.canvas_ = (BrailleCanvas *)local_60;
  end.line_.line_.line_.it_._M_current = (block_t *)uStack_58;
  end.line_.end_.line_.canvas_ = (BrailleCanvas *)local_50;
  end.line_.end_.line_.it_._M_current = cStack_48._M_current;
  margin_line(__return_storage_ptr__,pMVar2,lVar1 + 1,line,end);
  return __return_storage_ptr__;
}

Assistant:

margin_line next() const {
            return (overflow_ || line_ == end_) ? margin_line(margin_, overflow_ + 1, line_, end_)
                                                : margin_line(margin_, overflow_, std::next(line_), end_);
        }